

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

void __thiscall gl4cts::DirectStateAccess::Buffers::FunctionalTest::Cleanup(FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_po != 0) {
    (**(code **)(lVar3 + 0x1680))(0);
    (**(code **)(lVar3 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  if (-1 < this->m_attrib_location) {
    (**(code **)(lVar3 + 0x518))(this->m_attrib_location);
    this->m_attrib_location = -1;
  }
  if (this->m_bo_in != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_in);
    this->m_bo_in = 0;
  }
  if (this->m_bo_out != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_out);
    this->m_bo_out = 0;
  }
  (**(code **)(lVar3 + 0x5e0))(0x8c89);
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void FunctionalTest::Cleanup()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup objects. */
	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}

	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	if (0 <= m_attrib_location)
	{
		gl.disableVertexAttribArray(m_attrib_location);

		m_attrib_location = -1;
	}

	if (m_bo_in)
	{
		gl.deleteBuffers(1, &m_bo_in);

		m_bo_in = 0;
	}

	if (m_bo_out)
	{
		gl.deleteBuffers(1, &m_bo_out);

		m_bo_out = 0;
	}

	/* Make sure that rasterizer is turned on (default). */
	gl.enable(GL_RASTERIZER_DISCARD);

	/* Clean all errors. */
	while (gl.getError())
		;
}